

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O1

void gdImageFlipVertical(gdImagePtr im)

{
  uchar uVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  uchar *puVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = im->sy;
  if (im->trueColor == 0) {
    if (1 < iVar7) {
      lVar6 = 0;
      do {
        if (0 < im->sx) {
          lVar8 = 0;
          do {
            puVar5 = im->pixels[lVar6];
            uVar1 = puVar5[lVar8];
            puVar5[lVar8] = im->pixels[(int)(im->sy + ~(uint)lVar6)][lVar8];
            im->pixels[(int)(im->sy + ~(uint)lVar6)][lVar8] = uVar1;
            lVar8 = lVar8 + 1;
          } while (lVar8 < im->sx);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < im->sy / 2);
    }
  }
  else if (1 < iVar7) {
    ppiVar2 = im->tpixels;
    lVar6 = 0;
    do {
      if (0 < im->sx) {
        piVar3 = ppiVar2[lVar6];
        piVar4 = ppiVar2[(int)(iVar7 + ~(uint)lVar6)];
        lVar8 = 0;
        do {
          iVar7 = piVar3[lVar8];
          piVar3[lVar8] = ppiVar2[(int)(im->sy + ~(uint)lVar6)][lVar8];
          piVar4[lVar8] = iVar7;
          lVar8 = lVar8 + 1;
        } while (lVar8 < im->sx);
      }
      lVar6 = lVar6 + 1;
      iVar7 = im->sy;
    } while (lVar6 < iVar7 / 2);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipVertical(gdImagePtr im)
{
	register int x, y;

	if (im->trueColor) {
		for (y = 0; y < im->sy / 2; y++) {
			int *row_dst = im->tpixels[y];
			int *row_src = im->tpixels[im->sy - 1 - y];
			for (x = 0; x < im->sx; x++) {
				register int p;
				p = row_dst[x];
				row_dst[x] = im->tpixels[im->sy - 1 - y][x];
				row_src[x] = p;
			}
		}
	} else {
		unsigned char p;
		for (y = 0; y < im->sy / 2; y++) {
			for (x = 0; x < im->sx; x++) {
				p = im->pixels[y][x];
				im->pixels[y][x] =	im->pixels[im->sy - 1 - y][x];
				im->pixels[im->sy - 1 - y][x] = p;
			}
		}
	}
	return;
}